

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxATan2::Emit(FxATan2 *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  ExpEmit local_30;
  ExpEmit xreg;
  ExpEmit yreg;
  VMFunctionBuilder *build_local;
  FxATan2 *this_local;
  ExpEmit out;
  
  xreg = ToReg(this,build,this->yval);
  local_30 = ToReg(this,build,this->xval);
  ExpEmit::Free(&xreg,build);
  ExpEmit::Free(&local_30,build);
  ExpEmit::ExpEmit((ExpEmit *)&this_local,build,1,1);
  VMFunctionBuilder::Emit
            (build,0xab,(uint)(ushort)this_local,(uint)xreg.RegNum,(uint)local_30.RegNum);
  EVar1.RegType = this_local._2_1_;
  EVar1.RegCount = this_local._3_1_;
  EVar1.Konst = (bool)this_local._4_1_;
  EVar1.Fixed = (bool)this_local._5_1_;
  EVar1.Final = (bool)this_local._6_1_;
  EVar1.Target = (bool)this_local._7_1_;
  EVar1.RegNum = (ushort)this_local;
  return EVar1;
}

Assistant:

ExpEmit FxATan2::Emit(VMFunctionBuilder *build)
{
	ExpEmit yreg = ToReg(build, yval);
	ExpEmit xreg = ToReg(build, xval);
	yreg.Free(build);
	xreg.Free(build);
	ExpEmit out(build, REGT_FLOAT);
	build->Emit(OP_ATAN2, out.RegNum, yreg.RegNum, xreg.RegNum);
	return out;
}